

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

bool bssl::parse_dtls12_record(SSL *ssl,CBS *in,ParsedDTLSRecord *out)

{
  uint16_t uVar1;
  uint16_t epoch_00;
  uint16_t uVar2;
  int iVar3;
  DTLSRecordNumber DVar4;
  bool bVar5;
  bool version_ok;
  uint16_t epoch;
  uint64_t local_30;
  uint64_t epoch_and_seq;
  ParsedDTLSRecord *out_local;
  CBS *in_local;
  SSL *ssl_local;
  
  epoch_and_seq = (uint64_t)out;
  out_local = (ParsedDTLSRecord *)in;
  in_local = (CBS *)ssl;
  iVar3 = CBS_get_u16(in,&out->version);
  if (((iVar3 == 0) || (iVar3 = CBS_get_u64((CBS *)out_local,&local_30), iVar3 == 0)) ||
     (iVar3 = CBS_get_u16_length_prefixed((CBS *)out_local,(CBS *)(epoch_and_seq + 0x20)),
     iVar3 == 0)) {
    return false;
  }
  DVar4 = DTLSRecordNumber::FromCombined(local_30);
  *(uint64_t *)(epoch_and_seq + 8) = DVar4.combined_;
  epoch_00 = DTLSRecordNumber::epoch((DTLSRecordNumber *)(epoch_and_seq + 8));
  if (epoch_00 == 0) {
    bVar5 = (int)(uint)*(ushort *)(epoch_and_seq + 0x32) >> 8 == 0xfe;
  }
  else {
    uVar1 = *(uint16_t *)(epoch_and_seq + 0x32);
    uVar2 = dtls_record_version((SSL *)in_local);
    bVar5 = uVar1 == uVar2;
  }
  if (!bVar5) {
    return false;
  }
  if ((epoch_00 == *(uint16_t *)(in_local[3].len + 8)) &&
     (bVar5 = use_dtls13_record_header((SSL *)in_local,epoch_00), !bVar5)) {
    *(size_t *)epoch_and_seq = in_local[3].len + 8;
  }
  return true;
}

Assistant:

static bool parse_dtls12_record(SSL *ssl, CBS *in, ParsedDTLSRecord *out) {
  uint64_t epoch_and_seq;
  if (!CBS_get_u16(in, &out->version) ||  //
      !CBS_get_u64(in, &epoch_and_seq) ||
      !CBS_get_u16_length_prefixed(in, &out->body)) {
    return false;
  }
  out->number = DTLSRecordNumber::FromCombined(epoch_and_seq);

  uint16_t epoch = out->number.epoch();
  bool version_ok;
  if (epoch == 0) {
    // Only check the first byte. Enforcing beyond that can prevent decoding
    // version negotiation failure alerts.
    version_ok = (out->version >> 8) == DTLS1_VERSION_MAJOR;
  } else {
    version_ok = out->version == dtls_record_version(ssl);
  }
  if (!version_ok) {
    return false;
  }

  // Look up the corresponding epoch. In DTLS 1.2, we only need to consider one
  // epoch.
  if (epoch == ssl->d1->read_epoch.epoch &&
      !use_dtls13_record_header(ssl, epoch)) {
    out->read_epoch = &ssl->d1->read_epoch;
  }

  return true;
}